

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::predict_or_learn_cover<false>(cb_explore *data,single_learner *base,example *ec)

{
  float *pfVar1;
  long in_RDX;
  long in_RDI;
  __type_conflict _Var2;
  float min_prob;
  float additive_probability;
  v_array<unsigned_int> *predictions;
  v_array<float> *probabilities;
  size_t counter;
  size_t cover_size;
  uint32_t j;
  action_scores probs;
  uint32_t num_actions;
  wclass *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  long local_78;
  long local_70;
  undefined8 local_68;
  ulong local_60;
  undefined4 local_54;
  int local_50;
  undefined4 local_4c;
  undefined4 local_48;
  uint local_44;
  undefined8 local_40;
  v_array<ACTION_SCORE::action_score> *probs_00;
  example *ec_00;
  single_learner *psVar3;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  uVar4 = *(uint *)(in_RDI + 0x10);
  local_40 = *(undefined8 *)(in_RDX + 0x6850);
  probs_00 = *(v_array<ACTION_SCORE::action_score> **)(in_RDX + 0x6858);
  ec_00 = *(example **)(in_RDX + 0x6860);
  psVar3 = *(single_learner **)(in_RDX + 0x6868);
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  for (local_44 = 0; local_44 < uVar4; local_44 = local_44 + 1) {
    local_54 = 0x7f7fffff;
    local_50 = local_44 + 1;
    local_4c = 0;
    local_48 = 0;
    v_array<COST_SENSITIVE::wclass>::push_back
              ((v_array<COST_SENSITIVE::wclass> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  local_60 = *(ulong *)(in_RDI + 0x120);
  local_68 = *(undefined8 *)(in_RDI + 0x130);
  local_70 = in_RDI + 0x80;
  local_78 = in_RDI + 0x60;
  local_7c = 1.0 / (float)local_60;
  local_84 = 1.0 / (float)uVar4;
  _Var2 = std::sqrt<unsigned_long>(0x3d8c34);
  local_88 = 1.0 / (float)_Var2;
  pfVar1 = std::min<float>(&local_84,&local_88);
  local_80 = *pfVar1;
  *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(in_RDX + 0x6828);
  *(undefined8 *)(in_RDI + 0xa8) = *(undefined8 *)(in_RDX + 0x6830);
  *(undefined8 *)(in_RDI + 0xb0) = *(undefined8 *)(in_RDX + 0x6838);
  *(undefined8 *)(in_RDI + 0xb8) = *(undefined8 *)(in_RDX + 0x6840);
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0xc0);
  *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 200);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xd0);
  *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0xd8);
  get_cover_probabilities
            ((cb_explore *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),psVar3,ec_00,probs_00);
  *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0xa0);
  *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0xb0);
  *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0xb8);
  *(undefined8 *)(in_RDX + 0x6850) = local_40;
  *(v_array<ACTION_SCORE::action_score> **)(in_RDX + 0x6858) = probs_00;
  *(example **)(in_RDX + 0x6860) = ec_00;
  *(single_learner **)(in_RDX + 0x6868) = psVar3;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}